

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::drawTestCompute
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this,GLint program
          ,int binding)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  Vector<float,_4> *v;
  LayoutBindingTestResult *pLVar4;
  String *this_00;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 uVar6;
  undefined8 uVar5;
  allocator<char> local_dd;
  uint local_dc;
  LayoutBindingTestResult *local_d8;
  deUint32 fb_or_ssb;
  String local_c8;
  GLfloat buffer [4];
  String local_98;
  Vector<float,_4> local_78;
  Vec4 pixel;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_d8 = __return_storage_ptr__;
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
  lVar3 = (**(code **)(**(long **)(CONCAT44(extraout_var,iVar2) + 8) + 0x18))();
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x14])(this);
  if (iVar2 != 2) {
    deAssertFail("getStage() == ComputeShader",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cLayoutBindingTests.cpp"
                 ,0x48c);
  }
  (**(code **)(lVar3 + 0x1680))(program);
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  local_dc = binding;
  if (*(int *)(CONCAT44(extraout_var_00,iVar2) + 8) == 2) {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x23])
              (this,(ulong)(uint)binding);
    buffer[0] = 0.1;
    buffer[1] = 0.2;
    buffer[2] = 0.3;
    buffer[3] = 0.4;
    (**(code **)(lVar3 + 0x6c8))(1,&fb_or_ssb);
    (**(code **)(lVar3 + 0x40))(0x90d2,fb_or_ssb);
    (**(code **)(lVar3 + 0x150))(0x90d2,0x10,buffer,0x88ea);
    (**(code **)(lVar3 + 0x48))(0x90d2,0,fb_or_ssb);
    (**(code **)(lVar3 + 0x528))(1,1,1);
    (**(code **)(lVar3 + 0xdb8))(0x200);
    v = (Vector<float,_4> *)(**(code **)(lVar3 + 0xd00))(0x90d2,0,0x10);
    tcu::Vector<float,_4>::Vector(&pixel,v);
    (**(code **)(lVar3 + 0x1670))(0x90d2);
    (**(code **)(lVar3 + 0x40))(0x90d2,0);
    (**(code **)(lVar3 + 0x438))(1,&fb_or_ssb);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x24])
              (this,(ulong)local_dc);
    local_78.m_data[0] = 0.0;
    local_78.m_data[1] = 1.0;
    local_78.m_data[2] = 0.0;
    local_78.m_data[3] = 1.0;
    bVar1 = tcu::Vector<float,_4>::operator==(&pixel,&local_78);
    if (bVar1) {
LAB_00be197e:
      pLVar4 = local_d8;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      LayoutBindingTestResult::LayoutBindingTestResult(local_d8,true,&local_c8,false);
      this_00 = &local_c8;
      goto LAB_00be1a08;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"drawTestCompute failed",&local_dd);
    tcu::Vector<float,_4>::Vector(&local_40,&local_78);
    tcu::Vector<float,_4>::Vector(&local_50,&pixel);
    generateLog<tcu::Vector<float,4>,tcu::Vector<float,4>>
              (&local_c8,this,&local_98,&local_40,&local_50);
    pLVar4 = local_d8;
    local_d8->m_passed = false;
    local_d8->m_notRunForThisContext = false;
    std::__cxx11::string::string((string *)&local_d8->m_reason,(string *)&local_c8);
  }
  else {
    buffer[0] = 2.3879393e-38;
    (**(code **)(lVar3 + 0x6f8))(1,&pixel);
    (**(code **)(lVar3 + 0xb8))(0xde1,pixel.m_data[0]);
    (**(code **)(lVar3 + 0x1360))(0xde1,0x2801,0x2601);
    (**(code **)(lVar3 + 0x1380))(0xde1,1,0x8058,1,1);
    uVar5 = CONCAT44(uVar6,0x1908);
    (**(code **)(lVar3 + 0x13b8))(0xde1,0,0,0,1,1,uVar5,0x1401,buffer);
    uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x23])
              (this,(ulong)(uint)binding);
    uVar5 = CONCAT44(uVar6,0x8058);
    (**(code **)(lVar3 + 0x80))(0,pixel.m_data[0],0,0,0,0x88b9,uVar5);
    uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
    (**(code **)(lVar3 + 0x528))(1,1,1);
    (**(code **)(lVar3 + 0xdb8))(0x400);
    (**(code **)(lVar3 + 0x80))(0,0,0,0,0,0x88b9,CONCAT44(uVar6,0x8058));
    (**(code **)(lVar3 + 0x6d0))(1,&fb_or_ssb);
    (**(code **)(lVar3 + 0x78))(0x8d40,fb_or_ssb);
    (**(code **)(lVar3 + 0x6a0))(0x8d40,0x8ce0,0xde1,pixel.m_data[0],0);
    (**(code **)(lVar3 + 0x1220))(0,0,1,1,0x1908,0x1401,buffer);
    (**(code **)(lVar3 + 0x78))(0x8d40,0);
    (**(code **)(lVar3 + 0x440))(1,&fb_or_ssb);
    (**(code **)(lVar3 + 0x480))(1,&pixel);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x24])
              (this,(ulong)local_dc);
    if (buffer[0] == -1.7146522e+38) goto LAB_00be197e;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"drawTestCompute failed",(allocator<char> *)&local_78);
    pLVar4 = local_d8;
    generateLog<tcu::RGBA,tcu::RGBA>(&local_c8,this,&local_98,(RGBA)0xff00ff00,(RGBA)buffer[0]);
    pLVar4->m_passed = false;
    pLVar4->m_notRunForThisContext = false;
    std::__cxx11::string::string((string *)&pLVar4->m_reason,(string *)&local_c8);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  this_00 = &local_98;
LAB_00be1a08:
  std::__cxx11::string::~string((string *)this_00);
  return pLVar4;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::drawTestCompute(glw::GLint program, int binding)
{
	const glw::Functions& l_gl   = getContext().getRenderContext().getFunctions();
	bool				  passed = true;

	DE_TEST_ASSERT(getStage() == ComputeShader);

	l_gl.useProgram(program);

	deUint32 fb_or_ssb;

	if (getTestParameters().surface_type == Image)
	{
		bind(binding);

		glw::GLfloat buffer[4] = { 0.1f, 0.2f, 0.3f, 0.4f };
		l_gl.genBuffers(1, &fb_or_ssb);
		l_gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, fb_or_ssb);

		l_gl.bufferData(GL_SHADER_STORAGE_BUFFER, 4 * sizeof(glw::GLfloat), buffer, GL_DYNAMIC_COPY);

		l_gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, fb_or_ssb);

		l_gl.dispatchCompute(1, 1, 1);
		l_gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		tcu::Vec4 pixel =
			*(tcu::Vec4*)l_gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * sizeof(glw::GLfloat), GL_MAP_READ_BIT);
		l_gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);

		l_gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		l_gl.deleteBuffers(1, &fb_or_ssb);

		unbind(binding);

		tcu::Vec4 expected(0.0f, 1.0f, 0.0f, 1.0f);
		passed = (pixel == expected);
		if (!passed)
		{
			return LayoutBindingTestResult(passed, generateLog(String("drawTestCompute failed"), expected, pixel));
		}
	}
	else
	{
		deUint32 something = 0x01020304, tex;

		l_gl.genTextures(1, &tex);
		l_gl.bindTexture(GL_TEXTURE_2D, tex);
		l_gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		l_gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 1, 1);
		l_gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &something);

		bind(binding);

		l_gl.bindImageTexture(0, tex, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA8);

		l_gl.dispatchCompute(1, 1, 1);
		l_gl.memoryBarrier(GL_FRAMEBUFFER_BARRIER_BIT);

		l_gl.bindImageTexture(0, 0, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA8);

		l_gl.genFramebuffers(1, &fb_or_ssb);
		l_gl.bindFramebuffer(GL_FRAMEBUFFER, fb_or_ssb);
		l_gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);

		l_gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &something);

		l_gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		l_gl.deleteFramebuffers(1, &fb_or_ssb);
		l_gl.deleteTextures(1, &tex);

		unbind(binding);

		const deUint32 expected = 0xff00ff00;
		passed					= (expected == something);
		if (!passed)
		{
			return LayoutBindingTestResult(
				passed, generateLog(String("drawTestCompute failed"), tcu::RGBA(expected), tcu::RGBA(something)));
		}
	}

	return passed;
}